

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

void refineBasis(HighsLp *lp,HighsSolution *solution,HighsBasis *basis)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  reference pvVar7;
  const_reference pvVar8;
  long in_RDX;
  byte *in_RSI;
  int *in_RDI;
  HighsBasisStatus status_1;
  double upper_1;
  double lower_1;
  HighsInt iRow;
  HighsBasisStatus status;
  double upper;
  double lower;
  HighsInt iCol;
  HighsInt num_row;
  HighsInt num_col;
  bool have_highs_solution;
  value_type local_51;
  int local_40;
  value_type local_39;
  int local_28;
  
  bVar3 = *in_RSI;
  iVar4 = *in_RDI;
  iVar5 = in_RDI[1];
  for (local_28 = 0; local_28 < iVar4; local_28 = local_28 + 1) {
    pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (in_RDX + 0x30),(long)local_28);
    if (*pvVar7 == kNonbasic) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_28);
      dVar1 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_28);
      dVar2 = *pvVar8;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        bVar6 = highs_isInfinity(-dVar1);
        if (bVar6) {
          bVar6 = highs_isInfinity(dVar2);
          if (bVar6) {
            local_39 = kZero;
          }
          else {
            local_39 = kUpper;
          }
        }
        else {
          bVar6 = highs_isInfinity(dVar2);
          if (bVar6) {
            local_39 = kLower;
          }
          else if ((bVar3 & 1) == 0) {
            if (ABS(dVar2) <= ABS(dVar1)) {
              local_39 = kUpper;
            }
            else {
              local_39 = kLower;
            }
          }
          else {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),
                                (long)local_28);
            if ((dVar1 + dVar2) * 0.5 <= *pvVar8) {
              local_39 = kUpper;
            }
            else {
              local_39 = kLower;
            }
          }
        }
      }
      else {
        local_39 = kLower;
      }
      pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RDX + 0x30),(long)local_28);
      *pvVar7 = local_39;
    }
  }
  for (local_40 = 0; local_40 < iVar5; local_40 = local_40 + 1) {
    pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                        (in_RDX + 0x48),(long)local_40);
    if (*pvVar7 == kNonbasic) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),(long)local_40)
      ;
      dVar1 = *pvVar8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),(long)local_40)
      ;
      dVar2 = *pvVar8;
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        bVar6 = highs_isInfinity(-dVar1);
        if (bVar6) {
          bVar6 = highs_isInfinity(dVar2);
          if (bVar6) {
            local_51 = kZero;
          }
          else {
            local_51 = kUpper;
          }
        }
        else {
          bVar6 = highs_isInfinity(dVar2);
          if (bVar6) {
            local_51 = kLower;
          }
          else if ((bVar3 & 1) == 0) {
            if (ABS(dVar2) <= ABS(dVar1)) {
              local_51 = kUpper;
            }
            else {
              local_51 = kLower;
            }
          }
          else {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x38),
                                (long)local_40);
            if ((dVar1 + dVar2) * 0.5 <= *pvVar8) {
              local_51 = kUpper;
            }
            else {
              local_51 = kLower;
            }
          }
        }
      }
      else {
        local_51 = kLower;
      }
      pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RDX + 0x48),(long)local_40);
      *pvVar7 = local_51;
    }
  }
  return;
}

Assistant:

void refineBasis(const HighsLp& lp, const HighsSolution& solution,
                 HighsBasis& basis) {
  assert(basis.useful);
  assert(isBasisRightSize(lp, basis));
  const bool have_highs_solution = solution.value_valid;

  const HighsInt num_col = lp.num_col_;
  const HighsInt num_row = lp.num_row_;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    if (basis.col_status[iCol] != HighsBasisStatus::kNonbasic) continue;
    const double lower = lp.col_lower_[iCol];
    const double upper = lp.col_upper_[iCol];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower == upper) {
      status = HighsBasisStatus::kLower;
    } else if (!highs_isInfinity(-lower)) {
      if (!highs_isInfinity(upper)) {
        if (have_highs_solution) {
          if (solution.col_value[iCol] < 0.5 * (lower + upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        } else {
          if (fabs(lower) < fabs(upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        }
      } else {
        status = HighsBasisStatus::kLower;
      }
    } else if (!highs_isInfinity(upper)) {
      status = HighsBasisStatus::kUpper;
    } else {
      status = HighsBasisStatus::kZero;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    basis.col_status[iCol] = status;
  }

  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (basis.row_status[iRow] != HighsBasisStatus::kNonbasic) continue;
    const double lower = lp.row_lower_[iRow];
    const double upper = lp.row_upper_[iRow];
    HighsBasisStatus status = HighsBasisStatus::kNonbasic;
    if (lower == upper) {
      status = HighsBasisStatus::kLower;
    } else if (!highs_isInfinity(-lower)) {
      if (!highs_isInfinity(upper)) {
        if (have_highs_solution) {
          if (solution.row_value[iRow] < 0.5 * (lower + upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        } else {
          if (fabs(lower) < fabs(upper)) {
            status = HighsBasisStatus::kLower;
          } else {
            status = HighsBasisStatus::kUpper;
          }
        }
      } else {
        status = HighsBasisStatus::kLower;
      }
    } else if (!highs_isInfinity(upper)) {
      status = HighsBasisStatus::kUpper;
    } else {
      status = HighsBasisStatus::kZero;
    }
    assert(status != HighsBasisStatus::kNonbasic);
    basis.row_status[iRow] = status;
  }
}